

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationFactory.cpp
# Opt level: O0

OptimizationMethod * __thiscall
OpenMD::OptimizationFactory::createOptimization
          (OptimizationFactory *this,string *id,SimInfo *param_3)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  undefined4 extraout_var;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>_>
  *in_RDI;
  iterator i;
  _Self local_30;
  _Self local_28 [4];
  OptimizationMethod *local_8;
  
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>_>
       ::find(in_RDI,(key_type *)0x25fa06);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>_>
       ::end(in_RDI);
  bVar1 = std::operator!=(local_28,&local_30);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>
                           *)0x25fa38);
    iVar2 = (*ppVar3->second->_vptr_OptimizationCreator[2])();
    local_8 = (OptimizationMethod *)CONCAT44(extraout_var,iVar2);
  }
  else {
    local_8 = (OptimizationMethod *)0x0;
  }
  return local_8;
}

Assistant:

QuantLib::OptimizationMethod* OptimizationFactory::createOptimization(
      const std::string& id, SimInfo*) {
    CreatorMapType::iterator i = creatorMap_.find(id);
    if (i != creatorMap_.end()) {
      // invoke functor to create object
      return (i->second)->create();
    } else {
      return NULL;
    }
  }